

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_tunnel_test(player *p,loc_conflict grid)

{
  _Bool _Var1;
  player *p_local;
  loc_conflict grid_local;
  
  _Var1 = square_isknown((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = square_isperm((chunk *)cave,grid);
    if (_Var1) {
      msg("This seems to be permanent rock.");
      _Var1 = square_isperm((chunk *)p->cave,grid);
      if (!_Var1) {
        square_memorize((chunk *)cave,grid);
        square_light_spot((chunk *)cave,(loc)grid);
      }
      grid_local.x._3_1_ = false;
    }
    else {
      _Var1 = square_isdiggable((chunk *)cave,grid);
      if ((_Var1) || (_Var1 = square_iscloseddoor((chunk *)cave,grid), _Var1)) {
        grid_local.x._3_1_ = true;
      }
      else {
        msg("You see nothing there to tunnel.");
        _Var1 = square_isdiggable((chunk *)p->cave,grid);
        if ((_Var1) || (_Var1 = square_iscloseddoor((chunk *)p->cave,grid), _Var1)) {
          square_forget((chunk *)cave,grid);
          square_light_spot((chunk *)cave,(loc)grid);
        }
        grid_local.x._3_1_ = false;
      }
    }
  }
  else {
    msg("You see nothing there.");
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_tunnel_test(struct player *p, struct loc grid)
{

	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return (false);
	}

	/* Titanium */
	if (square_isperm(cave, grid)) {
		msg("This seems to be permanent rock.");
		if (!square_isperm(p->cave, grid)) {
			square_memorize(cave, grid);
			square_light_spot(cave, grid);
		}
		return (false);
	}

	/* Must be a wall/door/etc */
	if (!(square_isdiggable(cave, grid) || square_iscloseddoor(cave, grid))) {
		msg("You see nothing there to tunnel.");
		if (square_isdiggable(p->cave, grid)
				|| square_iscloseddoor(p->cave, grid)) {
			square_forget(cave, grid);
			square_light_spot(cave, grid);
		}
		return (false);
	}

	/* Okay */
	return (true);
}